

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall minja::IfTemplateToken::~IfTemplateToken(IfTemplateToken *this)

{
  IfTemplateToken *in_RDI;
  
  ~IfTemplateToken(in_RDI);
  operator_delete(in_RDI,0x40);
  return;
}

Assistant:

IfTemplateToken(const Location & loc, SpaceHandling pre, SpaceHandling post, std::shared_ptr<Expression> && c) : TemplateToken(Type::If, loc, pre, post), condition(std::move(c)) {}